

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

void __thiscall project::gen_cmake(project *this)

{
  project *ppVar1;
  project *this_00;
  ofstream outfile;
  undefined1 local_230 [32];
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  get_cmake_file_abi_cxx11_((string *)local_230,this);
  std::ofstream::ofstream(&local_210,(string *)local_230,_S_bin);
  ppVar1 = (project *)(local_230 + 0x10);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_header_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_dependencies_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_cpp_standard_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_defines_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_include_dirs_abi_cxx11_((string *)local_230,this);
  this_00 = (project *)local_230._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_autogen_vars_abi_cxx11_((string *)local_230,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_resource_files_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_source_list_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_executable_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_common_options_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  get_target_config_abi_cxx11_((string *)local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(char *)local_230._0_8_,local_230._8_8_);
  if ((project *)local_230._0_8_ != ppVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void project::gen_cmake()
{
    std::ofstream outfile (get_cmake_file(), std::ofstream::binary);

    outfile << get_header();
    outfile << get_dependencies();
    outfile << get_cpp_standard();
    outfile << get_defines();
    outfile << get_include_dirs();
    outfile << get_autogen_vars();
    outfile << get_resource_files();
    outfile << get_source_list();
    //outfile << get_source_groups();
    outfile << get_executable();
    outfile << get_common_options();
    outfile << get_target_config();

    outfile.close();
}